

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O2

int jas_stream_pad(jas_stream_t *stream,int n,int c)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = jas_getdbglevel();
  if (99 < iVar2) {
    jas_eprintf("jas_stream_pad(%p, %d, %d)\n",stream,n,(ulong)(uint)c);
  }
  if (n < 0) {
    jas_deprecated("negative count for jas_stream_pad");
  }
  iVar2 = 0;
  while( true ) {
    if (n + iVar2 < 1) {
      return n;
    }
    if ((stream->flags_ & 7U) != 0) break;
    if ((-1 < stream->rwlimit_) && (stream->rwlimit_ <= stream->rwcnt_)) {
      stream->flags_ = stream->flags_ | 4;
      break;
    }
    *(byte *)&stream->bufmode_ = (byte)stream->bufmode_ | 0x20;
    iVar3 = stream->cnt_;
    stream->cnt_ = iVar3 + -1;
    if (iVar3 < 1) {
      iVar3 = jas_stream_flushbuf(stream,c & 0xff);
      if (iVar3 == -1) break;
    }
    else {
      stream->rwcnt_ = stream->rwcnt_ + 1;
      puVar1 = stream->ptr_;
      stream->ptr_ = puVar1 + 1;
      *puVar1 = (uchar)c;
    }
    iVar2 = iVar2 + -1;
  }
  return -iVar2;
}

Assistant:

int jas_stream_pad(jas_stream_t *stream, int n, int c)
{
	int m;

	JAS_DBGLOG(100, ("jas_stream_pad(%p, %d, %d)\n", stream, n, c));

	if (n < 0) {
		jas_deprecated("negative count for jas_stream_pad");
	}
	m = n;
	for (m = n; m > 0; --m) {
		if (jas_stream_putc(stream, c) == EOF)
			return n - m;
	}
	return n;
}